

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream-parse.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  unsigned_short port_num;
  ostream *poVar2;
  size_t sVar3;
  element_type *peVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  uchar *puVar6;
  executor_op<boost::asio::detail::spawn_helper<boost::asio::executor_binder<void_(*)(),_boost::asio::strand<boost::asio::io_context::basic_executor_type<std::allocator<void>,_0U>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_basiliscos[P]cpp_bredis_examples_stream_parse_cpp:129:36)>,_std::allocator<void>,_boost::asio::detail::scheduler_operation>
  *op;
  int iVar7;
  socklen_t __len;
  sockaddr *__addr;
  spawn_helper<boost::asio::executor_binder<void_(*)(),_boost::asio::strand<boost::asio::io_context::basic_executor_type<std::allocator<void>,_0U>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_basiliscos[P]cpp_bredis_examples_stream_parse_cpp:129:36)>
  *context;
  undefined8 uVar8;
  spawn_data<boost::asio::executor_binder<void_(*)(),_boost::asio::strand<boost::asio::io_context::basic_executor_type<std::allocator<void>,_0U>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_basiliscos[P]cpp_bredis_examples_stream_parse_cpp:129:36)>
  *__tmp;
  long in_FS_OFFSET;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  allocator_t<std::allocator<void>_> local_28a;
  allocator<void> local_289;
  spawn_helper<boost::asio::executor_binder<void_(*)(),_boost::asio::strand<boost::asio::io_context::basic_executor_type<std::allocator<void>,_0U>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_basiliscos[P]cpp_bredis_examples_stream_parse_cpp:129:36)>
  local_288;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  dst_parts;
  io_context io_service;
  function_type tmp;
  type local_210;
  ptr local_1f0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  cmd_items;
  is_any_ofF<char> local_1c0;
  string address;
  socket_t socket;
  strand<boost::asio::io_context::basic_executor_type<std::allocator<void>,_0U>_> local_138;
  executor_binder<void_(*)(),_boost::asio::strand<boost::asio::io_context::basic_executor_type<std::allocator<void>,_0U>_>_>
  local_118;
  type ex;
  endpoint end_point;
  Connection<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
  c;
  address ip_address;
  basic_executor_type<std::allocator<void>,_0U> local_40;
  
  if (1 < argc) {
    std::__cxx11::string::string((string *)&address,argv[1],(allocator *)&socket);
    dst_parts.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    dst_parts.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    dst_parts.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    boost::algorithm::is_any_of<char[2]>(&local_1c0,(char (*) [2])":");
    iVar7 = 1;
    boost::algorithm::
    split<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::__cxx11::string&,boost::algorithm::detail::is_any_ofF<char>>
              (&dst_parts,&address,&local_1c0,token_compress_off);
    boost::algorithm::detail::is_any_ofF<char>::~is_any_ofF(&local_1c0);
    if ((long)dst_parts.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)dst_parts.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start == 0x40) {
      std::__cxx11::string::string((string *)&socket,"subscribe",(allocator *)&c);
      __l._M_len = 1;
      __l._M_array = (iterator)&socket;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&cmd_items,__l,(allocator_type *)&local_118);
      std::__cxx11::string::~string((string *)&socket);
      std::__copy_move<false,false,std::random_access_iterator_tag>::
      __copy_m<char**,std::back_insert_iterator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                (argv + 2,argv + (uint)argc,&cmd_items);
      boost::asio::io_context::io_context(&io_service);
      boost::asio::ip::make_address
                (&ip_address,
                 dst_parts.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start);
      port_num = boost::lexical_cast<unsigned_short,std::__cxx11::string>
                           (dst_parts.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + 1);
      poVar2 = std::operator<<((ostream *)&std::cout,"connecting to ");
      poVar2 = std::operator<<(poVar2,(string *)&address);
      std::operator<<(poVar2,"\n");
      boost::asio::ip::detail::endpoint::endpoint(&end_point.impl_,&ip_address,port_num);
      c.stream_.
      super_basic_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
      .impl_.service_._0_4_ = (uint)(end_point.impl_.data_.base.sa_family != 2) * 8 + 2;
      __len = 0;
      boost::asio::
      basic_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
      ::basic_socket<boost::asio::io_context>
                (&socket.
                  super_basic_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                 ,&io_service,(protocol_type *)&c,(type *)0x0);
      boost::asio::
      basic_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
      ::connect(&socket.
                 super_basic_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                ,(int)&end_point,__addr,__len);
      std::operator<<((ostream *)&std::cout,"connected\n");
      boost::asio::
      basic_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
      ::basic_socket((basic_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                      *)&c,&socket.
                            super_basic_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                    );
      sVar3 = boost::coroutines::stack_traits::default_size();
      local_40.bits_ = 0;
      local_40.io_context_ = &io_service;
      boost::asio::strand<boost::asio::io_context::basic_executor_type<std::allocator<void>,0u>>::
      strand<boost::asio::io_context::basic_executor_type<std::allocator<void>,0u>>
                ((strand<boost::asio::io_context::basic_executor_type<std::allocator<void>,0u>> *)
                 &local_138,&local_40,(type *)0x0);
      boost::asio::strand<boost::asio::io_context::basic_executor_type<std::allocator<void>,_0U>_>::
      strand((strand<boost::asio::io_context::basic_executor_type<std::allocator<void>,_0U>_> *)
             &local_118,&local_138);
      local_118.
      super_executor_binder_base<void_(*)(),_boost::asio::strand<boost::asio::io_context::basic_executor_type<std::allocator<void>,_0U>_>,_false>
      .target_ = boost::asio::detail::default_spawn_handler;
      local_288.data_.
      super___shared_ptr<boost::asio::detail::spawn_data<boost::asio::executor_binder<void_(*)(),_boost::asio::strand<boost::asio::io_context::basic_executor_type<std::allocator<void>,_0U>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_basiliscos[P]cpp_bredis_examples_stream_parse_cpp:129:36)>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)0x0;
      local_288.data_.
      super___shared_ptr<boost::asio::detail::spawn_data<boost::asio::executor_binder<void_(*)(),_boost::asio::strand<boost::asio::io_context::basic_executor_type<std::allocator<void>,_0U>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_basiliscos[P]cpp_bredis_examples_stream_parse_cpp:129:36)>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_288.attributes_.size = boost::coroutines::stack_traits::default_size();
      local_288.attributes_.do_unwind = stack_unwind;
      peVar4 = (element_type *)operator_new(0x58);
      (peVar4->coro_).
      super___weak_ptr<boost::coroutines::push_coroutine<void>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      (peVar4->coro_).
      super___weak_ptr<boost::coroutines::push_coroutine<void>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      boost::asio::
      executor_binder<void_(*)(),_boost::asio::strand<boost::asio::io_context::basic_executor_type<std::allocator<void>,_0U>_>_>
      ::executor_binder(&peVar4->handler_,&local_118);
      peVar4->call_handler_ = true;
      (peVar4->function_).cmd_items = &cmd_items;
      (peVar4->function_).c = &c;
      (peVar4->function_).io_service = &io_service;
      p_Var5 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x18);
      p_Var5->_M_use_count = 1;
      p_Var5->_M_weak_count = 1;
      p_Var5->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_base_001acb78;
      p_Var5[1]._vptr__Sp_counted_base = (_func_int **)peVar4;
      tmp.data_.
      super___shared_ptr<boost::asio::detail::spawn_data<boost::asio::executor_binder<void_(*)(),_boost::asio::strand<boost::asio::io_context::basic_executor_type<std::allocator<void>,_0U>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_basiliscos[P]cpp_bredis_examples_stream_parse_cpp:129:36)>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = local_288.data_.
                super___shared_ptr<boost::asio::detail::spawn_data<boost::asio::executor_binder<void_(*)(),_boost::asio::strand<boost::asio::io_context::basic_executor_type<std::allocator<void>,_0U>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_basiliscos[P]cpp_bredis_examples_stream_parse_cpp:129:36)>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr;
      tmp.data_.
      super___shared_ptr<boost::asio::detail::spawn_data<boost::asio::executor_binder<void_(*)(),_boost::asio::strand<boost::asio::io_context::basic_executor_type<std::allocator<void>,_0U>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_basiliscos[P]cpp_bredis_examples_stream_parse_cpp:129:36)>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi =
           local_288.data_.
           super___shared_ptr<boost::asio::detail::spawn_data<boost::asio::executor_binder<void_(*)(),_boost::asio::strand<boost::asio::io_context::basic_executor_type<std::allocator<void>,_0U>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_basiliscos[P]cpp_bredis_examples_stream_parse_cpp:129:36)>,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
      local_288.data_.
      super___shared_ptr<boost::asio::detail::spawn_data<boost::asio::executor_binder<void_(*)(),_boost::asio::strand<boost::asio::io_context::basic_executor_type<std::allocator<void>,_0U>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_basiliscos[P]cpp_bredis_examples_stream_parse_cpp:129:36)>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = peVar4;
      local_288.data_.
      super___shared_ptr<boost::asio::detail::spawn_data<boost::asio::executor_binder<void_(*)(),_boost::asio::strand<boost::asio::io_context::basic_executor_type<std::allocator<void>,_0U>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_basiliscos[P]cpp_bredis_examples_stream_parse_cpp:129:36)>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi = p_Var5;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&tmp.data_.
                  super___shared_ptr<boost::asio::detail::spawn_data<boost::asio::executor_binder<void_(*)(),_boost::asio::strand<boost::asio::io_context::basic_executor_type<std::allocator<void>,_0U>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_basiliscos[P]cpp_bredis_examples_stream_parse_cpp:129:36)>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
      local_288.attributes_.do_unwind = stack_unwind;
      local_288.attributes_.size = sVar3;
      boost::asio::strand<boost::asio::io_context::basic_executor_type<std::allocator<void>,_0U>_>::
      strand(&ex,(strand<boost::asio::io_context::basic_executor_type<std::allocator<void>,_0U>_> *)
                 &(local_288.data_.
                   super___shared_ptr<boost::asio::detail::spawn_data<boost::asio::executor_binder<void_(*)(),_boost::asio::strand<boost::asio::io_context::basic_executor_type<std::allocator<void>,_0U>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_basiliscos[P]cpp_bredis_examples_stream_parse_cpp:129:36)>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr)->handler_);
      asio_prefer_fn::impl::operator()
                (&local_210,(impl *)&asio_prefer_fn::static_instance<asio_prefer_fn::impl>::instance
                 ,&ex,(possibly_t<0> *)&boost::asio::execution::detail::blocking_t<0>::possibly,
                 &local_28a);
      if ((((byte)local_210.executor_.bits_ & 1) == 0) &&
         (puVar6 = boost::asio::detail::
                   call_stack<boost::asio::detail::strand_executor_service::strand_impl,_unsigned_char>
                   ::contains(local_210.impl_.
                              super___shared_ptr<boost::asio::detail::strand_executor_service::strand_impl,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr), puVar6 != (uchar *)0x0)) {
        context = &local_288;
        boost::asio::detail::
        spawn_helper<boost::asio::executor_binder<void_(*)(),_boost::asio::strand<boost::asio::io_context::basic_executor_type<std::allocator<void>,_0U>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/basiliscos[P]cpp-bredis/examples/stream-parse.cpp:129:36)>
        ::spawn_helper(&tmp,context);
        boost_asio_handler_invoke_helpers::
        invoke<boost::asio::detail::spawn_helper<boost::asio::executor_binder<void(*)(),boost::asio::strand<boost::asio::io_context::basic_executor_type<std::allocator<void>,0u>>>,main::__0>,boost::asio::detail::spawn_helper<boost::asio::executor_binder<void(*)(),boost::asio::strand<boost::asio::io_context::basic_executor_type<std::allocator<void>,0u>>>,main::__0>>
                  (&tmp,context);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&tmp.data_.
                    super___shared_ptr<boost::asio::detail::spawn_data<boost::asio::executor_binder<void_(*)(),_boost::asio::strand<boost::asio::io_context::basic_executor_type<std::allocator<void>,_0U>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_basiliscos[P]cpp_bredis_examples_stream_parse_cpp:129:36)>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount);
      }
      else {
        local_1f0.a = &local_289;
        if (*(long *)(in_FS_OFFSET + -0x10) == 0) {
          uVar8 = 0;
        }
        else {
          uVar8 = *(undefined8 *)(*(long *)(in_FS_OFFSET + -0x10) + 8);
        }
        op = (executor_op<boost::asio::detail::spawn_helper<boost::asio::executor_binder<void_(*)(),_boost::asio::strand<boost::asio::io_context::basic_executor_type<std::allocator<void>,_0U>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_basiliscos[P]cpp_bredis_examples_stream_parse_cpp:129:36)>,_std::allocator<void>,_boost::asio::detail::scheduler_operation>
              *)boost::asio::detail::thread_info_base::
                allocate<boost::asio::detail::thread_info_base::default_tag>(uVar8,0x40);
        (op->super_scheduler_operation).next_ = (scheduler_operation *)0x0;
        (op->super_scheduler_operation).func_ =
             boost::asio::detail::
             executor_op<boost::asio::detail::spawn_helper<boost::asio::executor_binder<void_(*)(),_boost::asio::strand<boost::asio::io_context::basic_executor_type<std::allocator<void>,_0U>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/basiliscos[P]cpp-bredis/examples/stream-parse.cpp:129:36)>,_std::allocator<void>,_boost::asio::detail::scheduler_operation>
             ::do_complete;
        (op->super_scheduler_operation).task_result_ = 0;
        local_1f0.v = op;
        boost::asio::detail::
        spawn_helper<boost::asio::executor_binder<void_(*)(),_boost::asio::strand<boost::asio::io_context::basic_executor_type<std::allocator<void>,_0U>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/basiliscos[P]cpp-bredis/examples/stream-parse.cpp:129:36)>
        ::spawn_helper(&op->handler_,&local_288);
        local_1f0.p = op;
        bVar1 = boost::asio::detail::strand_executor_service::enqueue
                          (&local_210.impl_,(scheduler_operation *)op);
        local_1f0.v = (void *)0x0;
        local_1f0.p = (executor_op<boost::asio::detail::spawn_helper<boost::asio::executor_binder<void_(*)(),_boost::asio::strand<boost::asio::io_context::basic_executor_type<std::allocator<void>,_0U>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_basiliscos[P]cpp_bredis_examples_stream_parse_cpp:129:36)>,_std::allocator<void>,_boost::asio::detail::scheduler_operation>
                       *)0x0;
        if (bVar1) {
          boost::asio::detail::strand_executor_service::
          invoker<const_boost::asio::io_context::basic_executor_type<std::allocator<void>,_0U>,_void>
          ::invoker((invoker<const_boost::asio::io_context::basic_executor_type<std::allocator<void>,_0U>,_void>
                     *)&tmp,&local_210.impl_,&local_210.executor_);
          boost::asio::io_context::basic_executor_type<std::allocator<void>,0u>::
          execute<boost::asio::detail::strand_executor_service::invoker<boost::asio::io_context::basic_executor_type<std::allocator<void>,0u>const,void>>
                    ((basic_executor_type<std::allocator<void>,0u> *)&local_210,
                     (invoker<const_boost::asio::io_context::basic_executor_type<std::allocator<void>,_0U>,_void>
                      *)&tmp);
          boost::asio::detail::strand_executor_service::
          invoker<const_boost::asio::io_context::basic_executor_type<std::allocator<void>,_0U>,_void>
          ::~invoker((invoker<const_boost::asio::io_context::basic_executor_type<std::allocator<void>,_0U>,_void>
                      *)&tmp);
        }
        boost::asio::detail::
        executor_op<boost::asio::detail::spawn_helper<boost::asio::executor_binder<void_(*)(),_boost::asio::strand<boost::asio::io_context::basic_executor_type<std::allocator<void>,_0U>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/basiliscos[P]cpp-bredis/examples/stream-parse.cpp:129:36)>,_std::allocator<void>,_boost::asio::detail::scheduler_operation>
        ::ptr::reset(&local_1f0);
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_210.impl_.
                  super___shared_ptr<boost::asio::detail::strand_executor_service::strand_impl,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&ex.impl_.
                  super___shared_ptr<boost::asio::detail::strand_executor_service::strand_impl,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_288.data_.
                  super___shared_ptr<boost::asio::detail::spawn_data<boost::asio::executor_binder<void_(*)(),_boost::asio::strand<boost::asio::io_context::basic_executor_type<std::allocator<void>,_0U>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_basiliscos[P]cpp_bredis_examples_stream_parse_cpp:129:36)>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_118.
                  super_executor_binder_base<void_(*)(),_boost::asio::strand<boost::asio::io_context::basic_executor_type<std::allocator<void>,_0U>_>,_false>
                  .executor_.impl_.
                  super___shared_ptr<boost::asio::detail::strand_executor_service::strand_impl,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_138.impl_.
                  super___shared_ptr<boost::asio::detail::strand_executor_service::strand_impl,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
      boost::asio::io_context::run(&io_service);
      poVar2 = std::operator<<((ostream *)&std::cout,"exiting...");
      std::operator<<(poVar2,"\n");
      boost::asio::detail::
      io_object_impl<boost::asio::detail::reactive_socket_service<boost::asio::ip::tcp>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
      ::~io_object_impl((io_object_impl<boost::asio::detail::reactive_socket_service<boost::asio::ip::tcp>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                         *)&c);
      boost::asio::detail::
      io_object_impl<boost::asio::detail::reactive_socket_service<boost::asio::ip::tcp>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
      ::~io_object_impl((io_object_impl<boost::asio::detail::reactive_socket_service<boost::asio::ip::tcp>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                         *)&socket);
      boost::asio::execution_context::~execution_context(&io_service.super_execution_context);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&cmd_items);
      iVar7 = 0;
    }
    else {
      poVar2 = std::operator<<((ostream *)&std::cout,"Usage : ");
      poVar2 = std::operator<<(poVar2,*argv);
      std::operator<<(poVar2," ip:port channel1 channel2 ...\n");
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&dst_parts);
    std::__cxx11::string::~string((string *)&address);
    return iVar7;
  }
  poVar2 = std::operator<<((ostream *)&std::cout,"Usage : ");
  poVar2 = std::operator<<(poVar2,*argv);
  std::operator<<(poVar2," ip:port channel1 channel2 ...\n");
  return 1;
}

Assistant:

int main(int argc, char **argv) {
    // common setup
    using socket_t = asio::ip::tcp::socket;
    using next_layer_t = socket_t;
    using Buffer = boost::asio::streambuf;
    using Iterator = typename r::to_iterator<Buffer>::iterator_t;

    if (argc < 2) {
        std::cout << "Usage : " << argv[0]
                  << " ip:port channel1 channel2 ...\n";
        return 1;
    }

    std::string address(argv[1]);
    std::vector<std::string> dst_parts;
    boost::split(dst_parts, address, boost::is_any_of(":"));
    if (dst_parts.size() != 2) {
        std::cout << "Usage : " << argv[0]
                  << " ip:port channel1 channel2 ...\n";
        return 1;
    }

    std::vector<std::string> cmd_items{"subscribe"};
    std::copy(&argv[2], &argv[argc], std::back_inserter(cmd_items));

    // connect to redis
    asio::io_context io_service;
    auto ip_address = asio::ip::make_address(dst_parts[0]);
    auto port = boost::lexical_cast<std::uint16_t>(dst_parts[1]);
    std::cout << "connecting to " << address << "\n";
    asio::ip::tcp::endpoint end_point(ip_address, port);
    socket_t socket(io_service, end_point.protocol());
    socket.connect(end_point);
    std::cout << "connected\n";

    // wrap socket into bredis connection
    r::Connection<next_layer_t> c(std::move(socket));

    // let's have it synchronous-like sexy syntax
    boost::asio::spawn(io_service, [&](boost::asio::yield_context
                                           yield) mutable {
        boost::system::error_code error_code;

        // this is rx_and tx_buff simultaneously. Usually,
        // you should NOT do that, i.e. in case of pipe-lining
        Buffer buff;

        // write subscription command
        r::single_command_t subscribe_cmd{cmd_items.cbegin(), cmd_items.cend()};
        auto consumed = c.async_write(buff, subscribe_cmd, yield[error_code]);

        if (error_code) {
            std::cout << "subscription error :: " << error_code.message()
                      << "\n";
            io_service.stop();
        }
        std::cout << "send subscription\n";
        buff.consume(consumed);

        // check subscription
        {
            r::marker_helpers::check_subscription<Iterator> check_subscription{
                std::move(subscribe_cmd)};

            for (auto it = cmd_items.cbegin() + 1; it != cmd_items.cend();
                 it++) {
                auto parse_result = c.async_read(buff, yield[error_code], 1);
                std::cout << "received something...\n";
                if (error_code) {
                    std::cout
                        << "reading result error :: " << error_code.message()
                        << "\n";
                    io_service.stop();
                    return;
                }

                bool confimed = boost::apply_visitor(check_subscription,
                                                     parse_result.result);
                if (!confimed) {
                    std::cout << "subscription was not confirmed\n";
                    io_service.stop();
                    return;
                }
                buff.consume(parse_result.consumed);
            }
            std::cout << "subscription(s) has been confirmed\n";
        }

        while (true) {
            // read the reply
            auto parse_result = c.async_read(buff, yield[error_code], 1);
            std::cout << "received something...\n";
            if (error_code) {
                std::cout << "reading result error :: " << error_code.message()
                          << "\n";
                break;
            }
            // extract the JSON from message payload

            json_extractor<Iterator> extract;
            auto payload = boost::apply_visitor(extract, parse_result.result);

            if (payload) {
                std::cout << "on channel '" << payload.get().channel
                          << "' got json :: " << payload.get().json.serialize()
                          << "\n";
            } else {
                std::cout << "wasn't able to parse payload as json\n";
            }

            buff.consume(parse_result.consumed);
        }
        io_service.stop();

    });

    io_service.run();
    std::cout << "exiting..."
              << "\n";
    return 0;
}